

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

void __thiscall sector_t::SetSpecial(sector_t *this,secspecial_t *spec)

{
  this->special = spec->special;
  this->damageamount = spec->damageamount;
  (this->damagetype).super_FName.Index = (spec->damagetype).super_FName.Index;
  this->damageinterval = spec->damageinterval;
  this->leakydamage = spec->leakydamage;
  this->Flags = spec->Flags & 0x7b0U | this->Flags & 0xfffff84f;
  return;
}

Assistant:

void sector_t::SetSpecial(const secspecial_t *spec)
{
	special = spec->special;
	damageamount = spec->damageamount;
	damagetype = spec->damagetype;
	damageinterval = spec->damageinterval;
	leakydamage = spec->leakydamage;
	Flags = (Flags & ~SECF_SPECIALFLAGS) | (spec->Flags & SECF_SPECIALFLAGS);
}